

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_2_0.cpp
# Opt level: O0

bool QOpenGLFunctions_2_0::isContextCompatible(QOpenGLContext *context)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  pair<int,_int> v;
  QSurfaceFormat f;
  bool local_31;
  int local_30 [2];
  pair<int,_int> local_28;
  int local_20;
  int local_1c;
  pair<int,_int> local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QOpenGLContext::format();
  local_18.first = -0x55555556;
  local_18.second = -0x55555556;
  local_1c = QSurfaceFormat::majorVersion();
  local_20 = QSurfaceFormat::minorVersion();
  std::pair<int,_int>::pair<int,_int,_true>(&local_18,&local_1c,&local_20);
  local_30[1] = 2;
  local_30[0] = 0;
  std::pair<int,_int>::pair<int,_int,_true>(&local_28,local_30 + 1,local_30);
  bVar1 = std::operator<(&local_18,&local_28);
  if (bVar1) {
    local_31 = false;
  }
  else {
    iVar2 = QSurfaceFormat::profile();
    if (iVar2 == 1) {
      local_31 = false;
    }
    else {
      local_31 = true;
    }
  }
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLFunctions_2_0::isContextCompatible(QOpenGLContext *context)
{
    Q_ASSERT(context);
    QSurfaceFormat f = context->format();
    const auto v = std::pair(f.majorVersion(), f.minorVersion());
    if (v < std::pair(2, 0))
        return false;

    if (f.profile() == QSurfaceFormat::CoreProfile)
        return false;

    return true;
}